

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

Snapshot * __thiscall
cmState::CreateVariableScopeSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine)

{
  PositionType *this_00;
  pointer pcVar1;
  cmLinkedTree<cmDefinitions> *pcVar2;
  PositionType PVar3;
  PositionType PVar4;
  iterator it;
  cmState *pcVar5;
  ReferenceType __src;
  PointerType pSVar6;
  PointerType pSVar7;
  iterator iVar8;
  iterator local_148;
  Snapshot *local_138;
  cmState *local_130;
  long local_128;
  string *local_120;
  undefined1 local_118 [168];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  size_type sStack_48;
  size_type local_40;
  size_type sStack_38;
  
  it = originSnapshot.Position;
  local_138 = __return_storage_ptr__;
  local_130 = this;
  local_128 = entryPointLine;
  local_120 = entryPointCommand;
  __src = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  memcpy((SnapshotDataType *)local_118,__src,0xa8);
  pcVar1 = (__src->EntryPointCommand)._M_dataplus._M_p;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (__src->EntryPointCommand)._M_string_length);
  local_50 = __src->EntryPointLine;
  sStack_48 = __src->IncludeDirectoryPosition;
  local_40 = __src->CompileDefinitionsPosition;
  sStack_38 = __src->CompileOptionsPosition;
  local_148 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,it,(SnapshotDataType *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  this_00 = &originSnapshot.Position;
  (pSVar6->ScopeParent).Tree = originSnapshot.Position.Tree;
  (pSVar6->ScopeParent).Position = originSnapshot.Position.Position;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar6->EntryPointLine = local_128;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  std::__cxx11::string::_M_assign((string *)&pSVar6->EntryPointCommand);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar6->SnapshotType = VariableScopeType;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar6->Keep = false;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  PVar4 = (pSVar6->Policies).Position;
  (pSVar7->PolicyScope).Tree = (pSVar6->Policies).Tree;
  (pSVar7->PolicyScope).Position = PVar4;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar2 = (pSVar6->Vars).Tree;
  if ((pcVar2 != (cmLinkedTree<cmDefinitions> *)0x0) &&
     ((pSVar6->Vars).Position <=
      (ulong)(((long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
    pcVar2 = (pSVar6->Vars).Tree;
    PVar3 = (pSVar6->Vars).Position;
    iVar8 = pSVar6->Vars;
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
    pcVar5 = local_130;
    (pSVar6->Parent).Tree = pcVar2;
    (pSVar6->Parent).Position = PVar3;
    iVar8 = cmLinkedTree<cmDefinitions>::Push(&local_130->VarTree,iVar8);
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
    pSVar6->Vars = iVar8;
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
    pcVar2 = (pSVar6->Vars).Tree;
    if ((pcVar2 != (cmLinkedTree<cmDefinitions> *)0x0) &&
       ((pSVar6->Vars).Position <=
        (ulong)(((long)(pcVar2->Data).
                       super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pcVar2->Data).
                       super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
      local_138->State = pcVar5;
      (local_138->Position).Tree = local_148.Tree;
      (local_138->Position).Position = local_148.Position;
      return local_138;
    }
    __assert_fail("pos->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x3cc,
                  "cmState::Snapshot cmState::CreateVariableScopeSnapshot(cmState::Snapshot, const std::string &, long)"
                 );
  }
  __assert_fail("originSnapshot.Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x3c6,
                "cmState::Snapshot cmState::CreateVariableScopeSnapshot(cmState::Snapshot, const std::string &, long)"
               );
}

Assistant:

cmState::Snapshot
cmState::CreateVariableScopeSnapshot(cmState::Snapshot originSnapshot,
                                     std::string const& entryPointCommand,
                                     long entryPointLine)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = VariableScopeType;
  pos->Keep = false;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin =
      originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  assert(pos->Vars.IsValid());
  return cmState::Snapshot(this, pos);
}